

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_range_filter.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::RegexRangeFilter::Rewrite
          (RegexRangeFilter *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  pointer puVar2;
  pointer puVar3;
  BoundComparisonExpression *pBVar4;
  undefined8 uVar5;
  pointer puVar6;
  int iVar7;
  pointer pLVar8;
  reference pvVar9;
  LogicalFilter *pLVar10;
  pointer pEVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  reference pvVar14;
  BoundConstantExpression *pBVar15;
  BoundComparisonExpression *this_00;
  pointer pLVar16;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  pointer *__ptr;
  pointer puVar17;
  pointer *__ptr_4;
  pointer puVar18;
  size_type __n;
  pointer this_01;
  templated_unique_single_t new_filter;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_e8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e0;
  BoundComparisonExpression *local_d8;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> local_d0;
  LogicalOperator *local_c8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_c0;
  Value local_b8;
  pointer local_78;
  Value local_70;
  
  local_c0._M_head_impl = (LogicalOperator *)this;
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  if ((pLVar8->children).
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pLVar8->children).
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&pLVar8->children,__n);
      local_c8 = (pvVar9->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar9->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      Rewrite((RegexRangeFilter *)&local_b8,op);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&pLVar8->children,__n);
      uVar5 = local_b8.type_._0_8_;
      local_b8.type_._0_8_ = (Expression *)0x0;
      _Var1._M_head_impl =
           (pvVar9->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar9->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar5;
      if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      local_b8.type_._0_8_ = (LogicalFilter *)0x0;
      if (local_c8 != (LogicalOperator *)0x0) {
        (*local_c8->_vptr_LogicalOperator[1])();
      }
      local_c8 = (LogicalOperator *)0x0;
      __n = __n + 1;
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
    } while (__n < (ulong)((long)(pLVar8->children).
                                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pLVar8->children).
                                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  if (pLVar8->type == LOGICAL_FILTER) {
    pLVar10 = (LogicalFilter *)operator_new(0x80);
    LogicalFilter::LogicalFilter(pLVar10);
    local_d0._M_head_impl = pLVar10;
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    this_01 = (pLVar8->expressions).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar17 = (pLVar8->expressions).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = puVar17;
    if (this_01 != puVar17) {
      do {
        local_78 = puVar6;
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_01);
        if ((pEVar11->super_BaseExpression).type == BOUND_FUNCTION) {
          pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_01);
          pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                              (&pEVar11->super_BaseExpression);
          iVar7 = ::std::__cxx11::string::compare
                            ((char *)&(pBVar12->function).super_BaseScalarFunction.
                                      super_SimpleFunction.super_Function.name);
          if (((iVar7 == 0) &&
              ((long)(pBVar12->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pBVar12->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x10)) &&
             (pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        ::operator->(&pBVar12->bind_info),
             *(char *)&pFVar13[0x11]._vptr_FunctionData != '\0')) {
            pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[](&pBVar12->children,0);
            pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(pvVar14);
            (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_e8,pEVar11);
            Value::BLOB(&local_70,(const_data_ptr_t)pFVar13[9]._vptr_FunctionData,
                        (idx_t)pFVar13[10]._vptr_FunctionData);
            pBVar15 = (BoundConstantExpression *)operator_new(0x98);
            Value::Value(&local_b8,&local_70);
            BoundConstantExpression::BoundConstantExpression(pBVar15,&local_b8);
            Value::~Value(&local_b8);
            local_d8 = (BoundComparisonExpression *)operator_new(0x68);
            local_b8.type_._0_8_ =
                 local_e8._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            local_e8._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 0x0;
            local_e0._M_head_impl = (Expression *)pBVar15;
            BoundComparisonExpression::BoundComparisonExpression
                      (local_d8,COMPARE_GREATERTHANOREQUALTO,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_b8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_e0);
            puVar17 = local_78;
            if ((BoundConstantExpression *)local_e0._M_head_impl != (BoundConstantExpression *)0x0)
            {
              (*(((Expression *)&(local_e0._M_head_impl)->super_BaseExpression)->
                super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_e0._M_head_impl = (Expression *)0x0;
            if ((Expression *)local_b8.type_._0_8_ != (Expression *)0x0) {
              (*((BaseExpression *)local_b8.type_._0_8_)->_vptr_BaseExpression[1])();
            }
            Value::~Value(&local_70);
            if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                local_e8._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (Expression *)0x0) {
              (**(code **)(*(long *)local_e8._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                          + 8))();
            }
            pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[](&pBVar12->children,0);
            pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(pvVar14);
            (*(pEVar11->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_e8,pEVar11);
            Value::BLOB(&local_70,(const_data_ptr_t)pFVar13[0xd]._vptr_FunctionData,
                        (idx_t)pFVar13[0xe]._vptr_FunctionData);
            pBVar15 = (BoundConstantExpression *)operator_new(0x98);
            Value::Value(&local_b8,&local_70);
            BoundConstantExpression::BoundConstantExpression(pBVar15,&local_b8);
            Value::~Value(&local_b8);
            this_00 = (BoundComparisonExpression *)operator_new(0x68);
            local_b8.type_._0_8_ =
                 local_e8._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            local_e8._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                 0x0;
            local_e0._M_head_impl = (Expression *)pBVar15;
            BoundComparisonExpression::BoundComparisonExpression
                      (this_00,COMPARE_LESSTHANOREQUALTO,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_b8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_e0);
            pBVar4 = local_d8;
            if ((BoundConstantExpression *)local_e0._M_head_impl != (BoundConstantExpression *)0x0)
            {
              (*(((Expression *)&(local_e0._M_head_impl)->super_BaseExpression)->
                super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_e0._M_head_impl = (Expression *)0x0;
            if ((Expression *)local_b8.type_._0_8_ != (Expression *)0x0) {
              (*((BaseExpression *)local_b8.type_._0_8_)->_vptr_BaseExpression[1])();
            }
            Value::~Value(&local_70);
            if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                local_e8._M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (Expression *)0x0) {
              (**(code **)(*(long *)local_e8._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                          + 8))();
            }
            pLVar10 = (LogicalFilter *)operator_new(0x70);
            local_b8.type_._0_8_ = pBVar4;
            local_70.type_._0_8_ = this_00;
            BoundConjunctionExpression::BoundConjunctionExpression
                      ((BoundConjunctionExpression *)pLVar10,CONJUNCTION_AND,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_b8,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_70);
            if ((BoundComparisonExpression *)local_70.type_._0_8_ !=
                (BoundComparisonExpression *)0x0) {
              (*(((Expression *)local_70.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1]
              )();
            }
            local_70.type_.id_ = INVALID;
            local_70.type_.physical_type_ = ~INVALID;
            local_70.type_._2_6_ = 0;
            if ((BoundComparisonExpression *)local_b8.type_._0_8_ !=
                (BoundComparisonExpression *)0x0) {
              (*(((Expression *)local_b8.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1]
              )();
            }
            pLVar16 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                    *)&local_d0);
            local_b8.type_._0_8_ = pLVar10;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&(pLVar16->super_LogicalOperator).expressions,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_b8);
            if ((LogicalFilter *)local_b8.type_._0_8_ != (LogicalFilter *)0x0) {
              (*((LogicalOperator *)local_b8.type_._0_8_)->_vptr_LogicalOperator[1])();
            }
          }
        }
        this_01 = this_01 + 1;
        puVar6 = local_78;
      } while (this_01 != puVar17);
    }
    pLVar16 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
              operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                          *)&local_d0);
    if ((pLVar16->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pLVar16->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      pLVar16 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&local_d0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ::_M_move_assign(&(pLVar16->super_LogicalOperator).children.
                        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                       ,&pLVar8->children);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      puVar2 = (pLVar8->children).
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (pLVar8->children).
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar18 = puVar2;
      if (puVar3 != puVar2) {
        do {
          _Var1._M_head_impl =
               (puVar18->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
            (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
          }
          (puVar18->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          puVar18 = puVar18 + 1;
        } while (puVar18 != puVar3);
        (pLVar8->children).
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      local_b8.type_._0_8_ = local_d0._M_head_impl;
      local_d0._M_head_impl = (LogicalFilter *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&pLVar8->children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_b8);
      if ((LogicalFilter *)local_b8.type_._0_8_ != (LogicalFilter *)0x0) {
        (*((LogicalOperator *)local_b8.type_._0_8_)->_vptr_LogicalOperator[1])();
      }
    }
    (local_c0._M_head_impl)->_vptr_LogicalOperator =
         (_func_int **)
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    if (local_d0._M_head_impl != (LogicalFilter *)0x0) {
      (*((local_d0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
  }
  else {
    (local_c0._M_head_impl)->_vptr_LogicalOperator =
         (_func_int **)
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>)
         local_c0._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> RegexRangeFilter::Rewrite(unique_ptr<LogicalOperator> op) {

	for (idx_t child_idx = 0; child_idx < op->children.size(); child_idx++) {
		op->children[child_idx] = Rewrite(std::move(op->children[child_idx]));
	}

	if (op->type != LogicalOperatorType::LOGICAL_FILTER) {
		return op;
	}

	auto new_filter = make_uniq<LogicalFilter>();

	for (auto &expr : op->expressions) {
		if (expr->GetExpressionType() == ExpressionType::BOUND_FUNCTION) {
			auto &func = expr->Cast<BoundFunctionExpression>();
			if (func.function.name != "regexp_full_match" || func.children.size() != 2) {
				continue;
			}
			auto &info = func.bind_info->Cast<RegexpMatchesBindData>();
			if (!info.range_success) {
				continue;
			}
			auto filter_left = make_uniq<BoundComparisonExpression>(
			    ExpressionType::COMPARE_GREATERTHANOREQUALTO, func.children[0]->Copy(),
			    make_uniq<BoundConstantExpression>(Value::BLOB_RAW(info.range_min)));
			auto filter_right = make_uniq<BoundComparisonExpression>(
			    ExpressionType::COMPARE_LESSTHANOREQUALTO, func.children[0]->Copy(),
			    make_uniq<BoundConstantExpression>(Value::BLOB_RAW(info.range_max)));
			auto filter_expr = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND,
			                                                         std::move(filter_left), std::move(filter_right));

			new_filter->expressions.push_back(std::move(filter_expr));
		}
	}

	if (!new_filter->expressions.empty()) {
		new_filter->children = std::move(op->children);
		op->children.clear();
		op->children.push_back(std::move(new_filter));
	}

	return op;
}